

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O2

void __thiscall
OpenMD::RestraintForceModifier::~RestraintForceModifier(RestraintForceModifier *this)

{
  RestWriter *this_00;
  
  (this->super_ForceModifier)._vptr_ForceModifier =
       (_func_int **)&PTR__RestraintForceModifier_002778f0;
  Utils::deletePointers<std::vector<OpenMD::Restraint*,std::allocator<OpenMD::Restraint*>>>
            (&this->restraints_);
  this_00 = this->restOut;
  if (this_00 != (RestWriter *)0x0) {
    RestWriter::~RestWriter(this_00);
  }
  operator_delete(this_00,0x18);
  std::__cxx11::string::~string((string *)&this->restOutput_);
  std::
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  ::~vector(&this->restInfo_);
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&(this->restrainedObjs_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  std::_Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::~_Vector_base
            (&(this->restrainedMols_).
              super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>);
  std::_Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>::~_Vector_base
            (&(this->restraints_).
              super__Vector_base<OpenMD::Restraint_*,_std::allocator<OpenMD::Restraint_*>_>);
  return;
}

Assistant:

RestraintForceModifier::~RestraintForceModifier() {
    Utils::deletePointers(restraints_);

    delete restOut;
  }